

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

uint32_t sx_hash_fnv32_str(char *str)

{
  uint local_1c;
  char *pcStack_18;
  uint32_t hval;
  char *s;
  char *str_local;
  
  local_1c = 0x811c9dc5;
  for (pcStack_18 = str; *pcStack_18 != '\0'; pcStack_18 = pcStack_18 + 1) {
    local_1c = ((int)*pcStack_18 ^ local_1c) * 0x1000193;
  }
  return local_1c;
}

Assistant:

SX_INLINE SX_CONSTEXPR uint32_t sx_hash_fnv32_str(const char* str)
{
    const char* s = str;

    uint32_t hval = FNV1_32_INIT;
    while (*s) {
        hval ^= (uint32_t)*s++;
        hval *= FNV1_32_PRIME;
    }

    return hval;
}